

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  seqDef **ppsVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  BYTE *pBVar8;
  ulong *puVar9;
  uint uVar10;
  uint uVar11;
  BYTE *pBVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  seqDef *psVar15;
  bool bVar16;
  undefined8 uVar17;
  uint uVar18;
  ulong *puVar19;
  BYTE *pBVar20;
  int *piVar21;
  byte bVar22;
  byte bVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  ulong *puVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong *puVar31;
  ulong *puVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  int iVar38;
  BYTE *pBVar39;
  BYTE *litEnd;
  ulong *puVar40;
  ulong uVar41;
  BYTE *litEnd_1;
  ulong *puVar42;
  uint uVar43;
  U32 UVar44;
  uint uVar45;
  long unaff_R15;
  BYTE *litEnd_7;
  ulong *puVar46;
  long lVar47;
  BYTE *prefixLowest;
  BYTE *litLimit_w_7;
  U32 *hashSmall;
  ulong *local_e0;
  int local_d8;
  int local_a0;
  ulong *local_98;
  BYTE *base;
  BYTE *iend;
  U32 prefixLowestIndex;
  int local_50;
  BYTE *litLimit_w;
  U32 *hashLong;
  BYTE *ilimit;
  
  pBVar12 = (ms->window).base;
  puVar5 = (ulong *)((long)src + srcSize);
  iVar34 = (int)pBVar12;
  iVar38 = (int)puVar5 - iVar34;
  uVar27 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar10 = (ms->window).dictLimit;
  uVar18 = iVar38 - uVar27;
  if (iVar38 - uVar10 <= uVar27) {
    uVar18 = uVar10;
  }
  if (ms->loadedDictEnd != 0) {
    uVar18 = uVar10;
  }
  pBVar39 = pBVar12 + uVar18;
  puVar31 = (ulong *)((ulong)((int)src == (int)pBVar39) + (long)src);
  iVar38 = (int)puVar31 - iVar34;
  uVar43 = iVar38 - uVar27;
  if (iVar38 - uVar10 <= uVar27) {
    uVar43 = uVar10;
  }
  puVar9 = (ulong *)((long)src + (srcSize - 8));
  if (ms->loadedDictEnd != 0) {
    uVar43 = uVar10;
  }
  uVar10 = *rep;
  uVar27 = rep[1];
  uVar43 = iVar38 - uVar43;
  uVar45 = uVar27;
  if (uVar43 < uVar27) {
    uVar45 = 0;
  }
  uVar30 = 0;
  if (uVar10 <= uVar43) {
    uVar30 = uVar10;
  }
  uVar41 = (ulong)uVar30;
  uVar11 = (ms->cParams).minMatch;
  pUVar13 = ms->hashTable;
  pUVar14 = ms->chainTable;
  if (uVar11 == 5) {
    if (puVar31 < puVar9) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar23 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar19 = puVar5 + -4;
      ppsVar4 = &seqStore->sequences;
      pBVar20 = pBVar12 + -1;
      local_e0 = (ulong *)pBVar20;
LAB_005ddac2:
      uVar28 = *puVar31;
      uVar33 = uVar28 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
      uVar36 = uVar28 * -0x30e4432345000000 >> (bVar23 & 0x3f);
      UVar44 = (int)puVar31 - iVar34;
      uVar30 = pUVar13[uVar33];
      uVar11 = pUVar14[uVar36];
      pUVar14[uVar36] = UVar44;
      pUVar13[uVar33] = UVar44;
      puVar42 = (ulong *)((long)puVar31 + 1);
      uVar35 = (uint)uVar41;
      if ((uVar35 != 0) && (*(int *)((long)puVar42 - uVar41) == *(int *)((long)puVar31 + 1))) {
        puVar40 = (ulong *)((long)puVar31 + 5);
        puVar46 = (ulong *)((long)puVar31 + (5 - uVar41));
        puVar32 = puVar40;
        if (puVar40 < puVar1) {
          uVar33 = *puVar40 ^ *puVar46;
          uVar28 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = uVar28 >> 3 & 0x1fffffff;
          if (*puVar46 == *puVar40) {
            puVar32 = (ulong *)((long)puVar31 + 0xd);
            puVar46 = (ulong *)((long)puVar31 + (0xd - uVar41));
            do {
              if (puVar1 <= puVar32) goto LAB_005ddd63;
              uVar33 = *puVar46;
              uVar36 = *puVar32;
              uVar37 = uVar36 ^ uVar33;
              uVar28 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (long)puVar32 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40);
              puVar32 = puVar32 + 1;
              puVar46 = puVar46 + 1;
            } while (uVar33 == uVar36);
          }
        }
        else {
LAB_005ddd63:
          if ((puVar32 < puVar2) && ((int)*puVar46 == (int)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 4);
            puVar46 = (ulong *)((long)puVar46 + 4);
          }
          if ((puVar32 < puVar3) && ((short)*puVar46 == (short)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 2);
            puVar46 = (ulong *)((long)puVar46 + 2);
          }
          if (puVar32 < puVar5) {
            puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar46 == (char)*puVar32));
          }
          uVar28 = (long)puVar32 - (long)puVar40;
        }
        uVar33 = (long)puVar42 - (long)src;
        if (puVar19 < puVar42) {
          puVar40 = (ulong *)seqStore->lit;
          puVar31 = puVar40;
          puVar32 = (ulong *)src;
          if (src <= puVar19) {
            puVar31 = (ulong *)((long)puVar40 + ((long)puVar19 - (long)src));
            uVar36 = *(ulong *)((long)src + 8);
            *puVar40 = *src;
            puVar40[1] = uVar36;
            puVar32 = puVar19;
            if (0x10 < (long)puVar19 - (long)src) {
              lVar47 = 0x10;
              do {
                uVar17 = ((undefined8 *)((long)src + lVar47))[1];
                puVar6 = (undefined8 *)((long)puVar40 + lVar47);
                *puVar6 = *(undefined8 *)((long)src + lVar47);
                puVar6[1] = uVar17;
                puVar7 = (undefined8 *)((long)src + lVar47 + 0x10);
                uVar17 = puVar7[1];
                puVar6[2] = *puVar7;
                puVar6[3] = uVar17;
                lVar47 = lVar47 + 0x20;
              } while (puVar6 + 4 < puVar31);
            }
          }
          if (puVar32 < puVar42) {
            lVar47 = 0;
            do {
              *(undefined1 *)((long)puVar31 + lVar47) = *(undefined1 *)((long)puVar32 + lVar47);
              lVar47 = lVar47 + 1;
            } while ((long)puVar42 - (long)puVar32 != lVar47);
          }
        }
        else {
          puVar31 = (ulong *)seqStore->lit;
          uVar36 = *(ulong *)((long)src + 8);
          *puVar31 = *src;
          puVar31[1] = uVar36;
          if (0x10 < uVar33) {
            pBVar24 = seqStore->lit;
            uVar36 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar24 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar24 + 0x18) = uVar36;
            if (0x20 < (long)uVar33) {
              lVar47 = 0;
              do {
                puVar6 = (undefined8 *)((long)src + lVar47 + 0x20);
                uVar17 = puVar6[1];
                pBVar25 = pBVar24 + lVar47 + 0x20;
                *(undefined8 *)pBVar25 = *puVar6;
                *(undefined8 *)(pBVar25 + 8) = uVar17;
                puVar6 = (undefined8 *)((long)src + lVar47 + 0x30);
                uVar17 = puVar6[1];
                *(undefined8 *)(pBVar25 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar25 + 0x18) = uVar17;
                lVar47 = lVar47 + 0x20;
              } while (pBVar25 + 0x20 < pBVar24 + uVar33);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        unaff_R15 = uVar28 + 4;
        uVar28 = uVar28 + 1;
        psVar15 = *ppsVar4;
        psVar15->litLength = (U16)uVar33;
        psVar15->offset = 1;
        puVar40 = puVar42;
        uVar30 = uVar35;
        uVar35 = uVar45;
        goto joined_r0x005ddfac;
      }
      puVar40 = puVar31;
      if ((uVar18 < uVar30) && (puVar32 = (ulong *)(pBVar12 + uVar30), *puVar32 == uVar28)) {
        puVar42 = puVar31 + 1;
        puVar26 = puVar32 + 1;
        puVar46 = puVar42;
        if (puVar42 < puVar1) {
          uVar28 = *puVar42 ^ *puVar26;
          uVar41 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
            }
          }
          uVar41 = uVar41 >> 3 & 0x1fffffff;
          if (*puVar26 == *puVar42) {
            puVar46 = puVar31 + 2;
            puVar26 = puVar32 + 2;
            do {
              if (puVar1 <= puVar46) goto LAB_005dde6b;
              uVar28 = *puVar26;
              uVar33 = *puVar46;
              uVar36 = uVar33 ^ uVar28;
              uVar41 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                }
              }
              uVar41 = (long)puVar46 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar42);
              puVar46 = puVar46 + 1;
              puVar26 = puVar26 + 1;
            } while (uVar28 == uVar33);
          }
        }
        else {
LAB_005dde6b:
          if ((puVar46 < puVar2) && ((int)*puVar26 == (int)*puVar46)) {
            puVar46 = (ulong *)((long)puVar46 + 4);
            puVar26 = (ulong *)((long)puVar26 + 4);
          }
          if ((puVar46 < puVar3) && ((short)*puVar26 == (short)*puVar46)) {
            puVar46 = (ulong *)((long)puVar46 + 2);
            puVar26 = (ulong *)((long)puVar26 + 2);
          }
          if (puVar46 < puVar5) {
            puVar46 = (ulong *)((long)puVar46 + (ulong)((char)*puVar26 == (char)*puVar46));
          }
          uVar41 = (long)puVar46 - (long)puVar42;
        }
        unaff_R15 = uVar41 + 8;
        local_a0 = (int)puVar32;
        local_e0 = (ulong *)(ulong)(uint)((int)puVar31 - local_a0);
        if ((uVar18 < uVar30) && (src < puVar31)) {
          pBVar24 = pBVar20 + uVar30;
          puVar40 = (ulong *)((long)puVar31 + -1);
          do {
            if ((BYTE)*puVar40 != *pBVar24) goto LAB_005de3c9;
            unaff_R15 = unaff_R15 + 1;
            puVar31 = (ulong *)((long)puVar40 + -1);
          } while ((pBVar39 < pBVar24) &&
                  (pBVar24 = pBVar24 + -1, bVar16 = src < puVar40, puVar40 = puVar31, bVar16));
LAB_005ddf08:
          puVar40 = (ulong *)((long)puVar31 + 1);
        }
        goto LAB_005de3cf;
      }
      if ((uVar18 < uVar11) && (piVar21 = (int *)(pBVar12 + uVar11), *piVar21 == (int)*puVar31)) {
        uVar28 = *puVar42;
        uVar33 = uVar28 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
        uVar30 = pUVar13[uVar33];
        pUVar13[uVar33] = UVar44 + 1;
        iVar38 = 0;
        if ((uVar18 < uVar30) && (puVar32 = (ulong *)(pBVar12 + uVar30), *puVar32 == uVar28)) {
          puVar40 = (ulong *)((long)puVar31 + 9);
          puVar46 = puVar32 + 1;
          puVar26 = puVar40;
          if (puVar40 < puVar1) {
            uVar33 = *puVar40 ^ *puVar46;
            uVar28 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = uVar28 >> 3 & 0x1fffffff;
            if (*puVar46 == *puVar40) {
              puVar26 = (ulong *)((long)puVar31 + 0x11);
              puVar46 = puVar32 + 2;
              do {
                if (puVar1 <= puVar26) goto LAB_005de20c;
                uVar33 = *puVar46;
                uVar36 = *puVar26;
                uVar37 = uVar36 ^ uVar33;
                uVar28 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = (long)puVar26 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40);
                puVar26 = puVar26 + 1;
                puVar46 = puVar46 + 1;
              } while (uVar33 == uVar36);
            }
          }
          else {
LAB_005de20c:
            if ((puVar26 < puVar2) && ((int)*puVar46 == (int)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 4);
              puVar46 = (ulong *)((long)puVar46 + 4);
            }
            if ((puVar26 < puVar3) && ((short)*puVar46 == (short)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 2);
              puVar46 = (ulong *)((long)puVar46 + 2);
            }
            if (puVar26 < puVar5) {
              puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar46 == (char)*puVar26));
            }
            uVar28 = (long)puVar26 - (long)puVar40;
          }
          unaff_R15 = uVar28 + 8;
          local_50 = (int)puVar32;
          local_e0 = (ulong *)(ulong)(uint)((int)puVar42 - local_50);
          iVar38 = 7;
          puVar40 = puVar42;
          if ((uVar18 < uVar30) && (src < puVar42)) {
            pBVar24 = pBVar20 + uVar30;
            while (puVar40 = puVar31, (BYTE)*puVar40 == *pBVar24) {
              unaff_R15 = unaff_R15 + 1;
              if ((pBVar24 <= pBVar39) ||
                 (pBVar24 = pBVar24 + -1, puVar31 = (ulong *)((long)puVar40 + -1), puVar40 <= src))
              goto LAB_005de2a8;
            }
            puVar40 = (ulong *)((long)puVar40 + 1);
          }
        }
LAB_005de2a8:
        if (iVar38 != 7) {
          if (iVar38 != 0) goto LAB_005de1f2;
          puVar31 = (ulong *)((long)puVar40 + 4);
          puVar32 = (ulong *)(piVar21 + 1);
          puVar42 = puVar31;
          if (puVar31 < puVar1) {
            uVar28 = *puVar31 ^ *puVar32;
            uVar41 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
              }
            }
            uVar41 = uVar41 >> 3 & 0x1fffffff;
            if (*puVar32 == *puVar31) {
              puVar42 = (ulong *)((long)puVar40 + 0xc);
              puVar32 = (ulong *)(piVar21 + 3);
              do {
                if (puVar1 <= puVar42) goto LAB_005de335;
                uVar28 = *puVar32;
                uVar33 = *puVar42;
                uVar36 = uVar33 ^ uVar28;
                uVar41 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                  }
                }
                uVar41 = (long)puVar42 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar31);
                puVar42 = puVar42 + 1;
                puVar32 = puVar32 + 1;
              } while (uVar28 == uVar33);
            }
          }
          else {
LAB_005de335:
            if ((puVar42 < puVar2) && ((int)*puVar32 == (int)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar42 < puVar3) && ((short)*puVar32 == (short)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar42 < puVar5) {
              puVar42 = (ulong *)((long)puVar42 + (ulong)((char)*puVar32 == (char)*puVar42));
            }
            uVar41 = (long)puVar42 - (long)puVar31;
          }
          unaff_R15 = uVar41 + 4;
          local_a0 = (int)piVar21;
          local_e0 = (ulong *)(ulong)(uint)((int)puVar40 - local_a0);
          if ((uVar18 < uVar11) && (src < puVar40)) {
            pBVar24 = pBVar20 + uVar11;
            puVar40 = (ulong *)((long)puVar40 + -1);
            do {
              if ((BYTE)*puVar40 != *pBVar24) goto LAB_005de3c9;
              unaff_R15 = unaff_R15 + 1;
              puVar31 = (ulong *)((long)puVar40 + -1);
            } while ((pBVar39 < pBVar24) &&
                    (pBVar24 = pBVar24 + -1, bVar16 = src < puVar40, puVar40 = puVar31, bVar16));
            goto LAB_005ddf08;
          }
        }
        goto LAB_005de3cf;
      }
      puVar40 = (ulong *)((long)puVar31 + ((long)puVar31 - (long)src >> 8) + 1);
      goto LAB_005de1f2;
    }
  }
  else if (uVar11 == 6) {
    if (puVar31 < puVar9) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar23 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar19 = puVar5 + -4;
      ppsVar4 = &seqStore->sequences;
      pBVar24 = pBVar12 + -1;
      pBVar20 = pBVar24;
      local_e0 = puVar3;
LAB_005dd016:
      uVar28 = *puVar31;
      uVar33 = uVar28 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
      uVar36 = uVar28 * -0x30e4432340650000 >> (bVar23 & 0x3f);
      UVar44 = (int)puVar31 - iVar34;
      uVar30 = pUVar13[uVar33];
      uVar11 = pUVar14[uVar36];
      pUVar14[uVar36] = UVar44;
      pUVar13[uVar33] = UVar44;
      puVar42 = (ulong *)((long)puVar31 + 1);
      uVar35 = (uint)uVar41;
      if ((uVar35 != 0) && (*(int *)((long)puVar42 - uVar41) == *(int *)((long)puVar31 + 1))) {
        puVar40 = (ulong *)((long)puVar31 + 5);
        puVar46 = (ulong *)((long)puVar31 + (5 - uVar41));
        puVar32 = puVar40;
        if (puVar40 < puVar1) {
          uVar33 = *puVar40 ^ *puVar46;
          uVar28 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = uVar28 >> 3 & 0x1fffffff;
          if (*puVar46 == *puVar40) {
            puVar32 = (ulong *)((long)puVar31 + 0xd);
            puVar46 = (ulong *)((long)puVar31 + (0xd - uVar41));
            do {
              if (puVar1 <= puVar32) goto LAB_005dd2b9;
              uVar33 = *puVar46;
              uVar36 = *puVar32;
              uVar37 = uVar36 ^ uVar33;
              uVar28 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (long)puVar32 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40);
              puVar32 = puVar32 + 1;
              puVar46 = puVar46 + 1;
            } while (uVar33 == uVar36);
          }
        }
        else {
LAB_005dd2b9:
          if ((puVar32 < puVar2) && ((int)*puVar46 == (int)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 4);
            puVar46 = (ulong *)((long)puVar46 + 4);
          }
          if ((puVar32 < puVar3) && ((short)*puVar46 == (short)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 2);
            puVar46 = (ulong *)((long)puVar46 + 2);
          }
          if (puVar32 < puVar5) {
            puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar46 == (char)*puVar32));
          }
          uVar28 = (long)puVar32 - (long)puVar40;
        }
        uVar33 = (long)puVar42 - (long)src;
        if (puVar19 < puVar42) {
          puVar40 = (ulong *)seqStore->lit;
          puVar31 = puVar40;
          puVar32 = (ulong *)src;
          if (src <= puVar19) {
            puVar31 = (ulong *)((long)puVar40 + ((long)puVar19 - (long)src));
            uVar36 = *(ulong *)((long)src + 8);
            *puVar40 = *src;
            puVar40[1] = uVar36;
            puVar32 = puVar19;
            if (0x10 < (long)puVar19 - (long)src) {
              lVar47 = 0x10;
              do {
                uVar17 = ((undefined8 *)((long)src + lVar47))[1];
                puVar6 = (undefined8 *)((long)puVar40 + lVar47);
                *puVar6 = *(undefined8 *)((long)src + lVar47);
                puVar6[1] = uVar17;
                puVar7 = (undefined8 *)((long)src + lVar47 + 0x10);
                uVar17 = puVar7[1];
                puVar6[2] = *puVar7;
                puVar6[3] = uVar17;
                lVar47 = lVar47 + 0x20;
              } while (puVar6 + 4 < puVar31);
            }
          }
          if (puVar32 < puVar42) {
            lVar47 = 0;
            do {
              *(undefined1 *)((long)puVar31 + lVar47) = *(undefined1 *)((long)puVar32 + lVar47);
              lVar47 = lVar47 + 1;
            } while ((long)puVar42 - (long)puVar32 != lVar47);
          }
        }
        else {
          puVar31 = (ulong *)seqStore->lit;
          uVar36 = *(ulong *)((long)src + 8);
          *puVar31 = *src;
          puVar31[1] = uVar36;
          if (0x10 < uVar33) {
            pBVar20 = seqStore->lit;
            uVar36 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar20 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar20 + 0x18) = uVar36;
            if (0x20 < (long)uVar33) {
              lVar47 = 0;
              do {
                puVar6 = (undefined8 *)((long)src + lVar47 + 0x20);
                uVar17 = puVar6[1];
                pBVar25 = pBVar20 + lVar47 + 0x20;
                *(undefined8 *)pBVar25 = *puVar6;
                *(undefined8 *)(pBVar25 + 8) = uVar17;
                puVar6 = (undefined8 *)((long)src + lVar47 + 0x30);
                uVar17 = puVar6[1];
                *(undefined8 *)(pBVar25 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar25 + 0x18) = uVar17;
                lVar47 = lVar47 + 0x20;
              } while (pBVar25 + 0x20 < pBVar20 + uVar33);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        pBVar20 = (BYTE *)(uVar28 + 4);
        pBVar25 = (BYTE *)(uVar28 + 1);
        psVar15 = *ppsVar4;
        psVar15->litLength = (U16)uVar33;
        psVar15->offset = 1;
        puVar40 = puVar42;
        uVar30 = uVar35;
        goto joined_r0x005dd424;
      }
      puVar40 = puVar31;
      if ((uVar18 < uVar30) && (puVar32 = (ulong *)(pBVar12 + uVar30), *puVar32 == uVar28)) {
        puVar42 = puVar31 + 1;
        puVar46 = puVar32 + 1;
        puVar26 = puVar42;
        if (puVar42 < puVar1) {
          uVar28 = *puVar42 ^ *puVar46;
          uVar41 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
            }
          }
          uVar41 = uVar41 >> 3 & 0x1fffffff;
          if (*puVar46 == *puVar42) {
            puVar26 = puVar31 + 2;
            puVar46 = puVar32 + 2;
            do {
              if (puVar1 <= puVar26) goto LAB_005dd698;
              uVar28 = *puVar46;
              uVar33 = *puVar26;
              uVar36 = uVar33 ^ uVar28;
              uVar41 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                }
              }
              uVar41 = (long)puVar26 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar42);
              puVar26 = puVar26 + 1;
              puVar46 = puVar46 + 1;
            } while (uVar28 == uVar33);
          }
        }
        else {
LAB_005dd698:
          if ((puVar26 < puVar2) && ((int)*puVar46 == (int)*puVar26)) {
            puVar26 = (ulong *)((long)puVar26 + 4);
            puVar46 = (ulong *)((long)puVar46 + 4);
          }
          if ((puVar26 < puVar3) && ((short)*puVar46 == (short)*puVar26)) {
            puVar26 = (ulong *)((long)puVar26 + 2);
            puVar46 = (ulong *)((long)puVar46 + 2);
          }
          if (puVar26 < puVar5) {
            puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar46 == (char)*puVar26));
          }
          uVar41 = (long)puVar26 - (long)puVar42;
        }
        pBVar20 = (BYTE *)(uVar41 + 8);
        local_d8 = (int)puVar32;
        local_e0 = (ulong *)(ulong)(uint)((int)puVar31 - local_d8);
        if ((uVar18 < uVar30) && (src < puVar31)) {
          pBVar25 = pBVar24 + uVar30;
          puVar40 = (ulong *)((long)puVar31 + -1);
          do {
            if ((BYTE)*puVar40 != *pBVar25) goto LAB_005dd914;
            pBVar20 = pBVar20 + 1;
            puVar31 = (ulong *)((long)puVar40 + -1);
          } while ((pBVar39 < pBVar25) &&
                  (pBVar25 = pBVar25 + -1, bVar16 = src < puVar40, puVar40 = puVar31, bVar16));
LAB_005dd730:
          puVar40 = (ulong *)((long)puVar31 + 1);
        }
        goto LAB_005dd91a;
      }
      if ((uVar18 < uVar11) && (piVar21 = (int *)(pBVar12 + uVar11), *piVar21 == (int)*puVar31)) {
        uVar28 = *puVar42;
        uVar33 = uVar28 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
        uVar30 = pUVar13[uVar33];
        pUVar13[uVar33] = UVar44 + 1;
        iVar38 = 0;
        if ((uVar18 < uVar30) && (puVar32 = (ulong *)(pBVar12 + uVar30), *puVar32 == uVar28)) {
          puVar40 = (ulong *)((long)puVar31 + 9);
          puVar46 = puVar32 + 1;
          puVar26 = puVar40;
          if (puVar40 < puVar1) {
            uVar33 = *puVar40 ^ *puVar46;
            uVar28 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = uVar28 >> 3 & 0x1fffffff;
            if (*puVar46 == *puVar40) {
              puVar26 = (ulong *)((long)puVar31 + 0x11);
              puVar46 = puVar32 + 2;
              do {
                if (puVar1 <= puVar26) goto LAB_005dd742;
                uVar33 = *puVar46;
                uVar36 = *puVar26;
                uVar37 = uVar36 ^ uVar33;
                uVar28 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = (long)puVar26 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40);
                puVar26 = puVar26 + 1;
                puVar46 = puVar46 + 1;
              } while (uVar33 == uVar36);
            }
          }
          else {
LAB_005dd742:
            if ((puVar26 < puVar2) && ((int)*puVar46 == (int)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 4);
              puVar46 = (ulong *)((long)puVar46 + 4);
            }
            if ((puVar26 < puVar3) && ((short)*puVar46 == (short)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 2);
              puVar46 = (ulong *)((long)puVar46 + 2);
            }
            if (puVar26 < puVar5) {
              puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar46 == (char)*puVar26));
            }
            uVar28 = (long)puVar26 - (long)puVar40;
          }
          pBVar20 = (BYTE *)(uVar28 + 8);
          local_50 = (int)puVar32;
          local_e0 = (ulong *)(ulong)(uint)((int)puVar42 - local_50);
          iVar38 = 7;
          puVar40 = puVar42;
          if ((uVar18 < uVar30) && (src < puVar42)) {
            pBVar25 = pBVar24 + uVar30;
            while (puVar40 = puVar31, (BYTE)*puVar40 == *pBVar25) {
              pBVar20 = pBVar20 + 1;
              if ((pBVar25 <= pBVar39) ||
                 (pBVar25 = pBVar25 + -1, puVar31 = (ulong *)((long)puVar40 + -1), puVar40 <= src))
              goto LAB_005dd7f3;
            }
            puVar40 = (ulong *)((long)puVar40 + 1);
          }
        }
LAB_005dd7f3:
        if (iVar38 != 7) {
          if (iVar38 != 0) goto LAB_005dd685;
          puVar31 = (ulong *)((long)puVar40 + 4);
          puVar42 = (ulong *)(piVar21 + 1);
          puVar32 = puVar31;
          if (puVar31 < puVar1) {
            uVar28 = *puVar31 ^ *puVar42;
            uVar41 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
              }
            }
            uVar41 = uVar41 >> 3 & 0x1fffffff;
            if (*puVar42 == *puVar31) {
              puVar32 = (ulong *)((long)puVar40 + 0xc);
              puVar42 = (ulong *)(piVar21 + 3);
              do {
                if (puVar1 <= puVar32) goto LAB_005dd880;
                uVar28 = *puVar42;
                uVar33 = *puVar32;
                uVar36 = uVar33 ^ uVar28;
                uVar41 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                  }
                }
                uVar41 = (long)puVar32 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar31);
                puVar32 = puVar32 + 1;
                puVar42 = puVar42 + 1;
              } while (uVar28 == uVar33);
            }
          }
          else {
LAB_005dd880:
            if ((puVar32 < puVar2) && ((int)*puVar42 == (int)*puVar32)) {
              puVar32 = (ulong *)((long)puVar32 + 4);
              puVar42 = (ulong *)((long)puVar42 + 4);
            }
            if ((puVar32 < puVar3) && ((short)*puVar42 == (short)*puVar32)) {
              puVar32 = (ulong *)((long)puVar32 + 2);
              puVar42 = (ulong *)((long)puVar42 + 2);
            }
            if (puVar32 < puVar5) {
              puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar42 == (char)*puVar32));
            }
            uVar41 = (long)puVar32 - (long)puVar31;
          }
          pBVar20 = (BYTE *)(uVar41 + 4);
          local_a0 = (int)piVar21;
          local_e0 = (ulong *)(ulong)(uint)((int)puVar40 - local_a0);
          if ((uVar18 < uVar11) && (src < puVar40)) {
            pBVar25 = pBVar24 + uVar11;
            puVar40 = (ulong *)((long)puVar40 + -1);
            do {
              if ((BYTE)*puVar40 != *pBVar25) goto LAB_005dd914;
              pBVar20 = pBVar20 + 1;
              puVar31 = (ulong *)((long)puVar40 + -1);
            } while ((pBVar39 < pBVar25) &&
                    (pBVar25 = pBVar25 + -1, bVar16 = src < puVar40, puVar40 = puVar31, bVar16));
            goto LAB_005dd730;
          }
        }
        goto LAB_005dd91a;
      }
      puVar40 = (ulong *)((long)puVar31 + ((long)puVar31 - (long)src >> 8) + 1);
      goto LAB_005dd685;
    }
  }
  else if (uVar11 == 7) {
    if (puVar31 < puVar9) {
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      bVar23 = 0x40 - (char)(ms->cParams).chainLog;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar19 = puVar5 + -4;
      ppsVar4 = &seqStore->sequences;
      pBVar20 = pBVar12 + -1;
      local_e0 = (ulong *)pBVar20;
LAB_005dc540:
      uVar28 = *puVar31;
      uVar33 = uVar28 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
      uVar36 = uVar28 * -0x30e44323405a9d00 >> (bVar23 & 0x3f);
      UVar44 = (int)puVar31 - iVar34;
      uVar30 = pUVar13[uVar33];
      uVar11 = pUVar14[uVar36];
      pUVar14[uVar36] = UVar44;
      pUVar13[uVar33] = UVar44;
      puVar42 = (ulong *)((long)puVar31 + 1);
      uVar35 = (uint)uVar41;
      if ((uVar35 != 0) && (*(int *)((long)puVar42 - uVar41) == *(int *)((long)puVar31 + 1))) {
        puVar40 = (ulong *)((long)puVar31 + 5);
        puVar46 = (ulong *)((long)puVar31 + (5 - uVar41));
        puVar32 = puVar40;
        if (puVar40 < puVar1) {
          uVar33 = *puVar40 ^ *puVar46;
          uVar28 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = uVar28 >> 3 & 0x1fffffff;
          if (*puVar46 == *puVar40) {
            puVar32 = (ulong *)((long)puVar31 + 0xd);
            puVar46 = (ulong *)((long)puVar31 + (0xd - uVar41));
            do {
              if (puVar1 <= puVar32) goto LAB_005dc7e1;
              uVar33 = *puVar46;
              uVar36 = *puVar32;
              uVar37 = uVar36 ^ uVar33;
              uVar28 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (long)puVar32 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40);
              puVar32 = puVar32 + 1;
              puVar46 = puVar46 + 1;
            } while (uVar33 == uVar36);
          }
        }
        else {
LAB_005dc7e1:
          if ((puVar32 < puVar2) && ((int)*puVar46 == (int)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 4);
            puVar46 = (ulong *)((long)puVar46 + 4);
          }
          if ((puVar32 < puVar3) && ((short)*puVar46 == (short)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 2);
            puVar46 = (ulong *)((long)puVar46 + 2);
          }
          if (puVar32 < puVar5) {
            puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar46 == (char)*puVar32));
          }
          uVar28 = (long)puVar32 - (long)puVar40;
        }
        uVar33 = (long)puVar42 - (long)src;
        if (puVar19 < puVar42) {
          puVar40 = (ulong *)seqStore->lit;
          puVar31 = puVar40;
          puVar32 = (ulong *)src;
          if (src <= puVar19) {
            puVar31 = (ulong *)((long)puVar40 + ((long)puVar19 - (long)src));
            uVar36 = *(ulong *)((long)src + 8);
            *puVar40 = *src;
            puVar40[1] = uVar36;
            puVar32 = puVar19;
            if (0x10 < (long)puVar19 - (long)src) {
              lVar47 = 0x10;
              do {
                uVar17 = ((undefined8 *)((long)src + lVar47))[1];
                puVar6 = (undefined8 *)((long)puVar40 + lVar47);
                *puVar6 = *(undefined8 *)((long)src + lVar47);
                puVar6[1] = uVar17;
                puVar7 = (undefined8 *)((long)src + lVar47 + 0x10);
                uVar17 = puVar7[1];
                puVar6[2] = *puVar7;
                puVar6[3] = uVar17;
                lVar47 = lVar47 + 0x20;
              } while (puVar6 + 4 < puVar31);
            }
          }
          if (puVar32 < puVar42) {
            lVar47 = 0;
            do {
              *(undefined1 *)((long)puVar31 + lVar47) = *(undefined1 *)((long)puVar32 + lVar47);
              lVar47 = lVar47 + 1;
            } while ((long)puVar42 - (long)puVar32 != lVar47);
          }
        }
        else {
          puVar31 = (ulong *)seqStore->lit;
          uVar36 = *(ulong *)((long)src + 8);
          *puVar31 = *src;
          puVar31[1] = uVar36;
          if (0x10 < uVar33) {
            pBVar24 = seqStore->lit;
            uVar36 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar24 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar24 + 0x18) = uVar36;
            if (0x20 < (long)uVar33) {
              lVar47 = 0;
              do {
                puVar6 = (undefined8 *)((long)src + lVar47 + 0x20);
                uVar17 = puVar6[1];
                pBVar25 = pBVar24 + lVar47 + 0x20;
                *(undefined8 *)pBVar25 = *puVar6;
                *(undefined8 *)(pBVar25 + 8) = uVar17;
                puVar6 = (undefined8 *)((long)src + lVar47 + 0x30);
                uVar17 = puVar6[1];
                *(undefined8 *)(pBVar25 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar25 + 0x18) = uVar17;
                lVar47 = lVar47 + 0x20;
              } while (pBVar25 + 0x20 < pBVar24 + uVar33);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        unaff_R15 = uVar28 + 4;
        uVar28 = uVar28 + 1;
        psVar15 = *ppsVar4;
        psVar15->litLength = (U16)uVar33;
        psVar15->offset = 1;
        puVar40 = puVar42;
        uVar30 = uVar35;
        uVar35 = uVar45;
        goto joined_r0x005dca29;
      }
      puVar40 = puVar31;
      if ((uVar18 < uVar30) && (puVar32 = (ulong *)(pBVar12 + uVar30), *puVar32 == uVar28)) {
        puVar42 = puVar31 + 1;
        puVar26 = puVar32 + 1;
        puVar46 = puVar42;
        if (puVar42 < puVar1) {
          uVar28 = *puVar42 ^ *puVar26;
          uVar41 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
            }
          }
          uVar41 = uVar41 >> 3 & 0x1fffffff;
          if (*puVar26 == *puVar42) {
            puVar46 = puVar31 + 2;
            puVar26 = puVar32 + 2;
            do {
              if (puVar1 <= puVar46) goto LAB_005dc8e9;
              uVar28 = *puVar26;
              uVar33 = *puVar46;
              uVar36 = uVar33 ^ uVar28;
              uVar41 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                }
              }
              uVar41 = (long)puVar46 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar42);
              puVar46 = puVar46 + 1;
              puVar26 = puVar26 + 1;
            } while (uVar28 == uVar33);
          }
        }
        else {
LAB_005dc8e9:
          if ((puVar46 < puVar2) && ((int)*puVar26 == (int)*puVar46)) {
            puVar46 = (ulong *)((long)puVar46 + 4);
            puVar26 = (ulong *)((long)puVar26 + 4);
          }
          if ((puVar46 < puVar3) && ((short)*puVar26 == (short)*puVar46)) {
            puVar46 = (ulong *)((long)puVar46 + 2);
            puVar26 = (ulong *)((long)puVar26 + 2);
          }
          if (puVar46 < puVar5) {
            puVar46 = (ulong *)((long)puVar46 + (ulong)((char)*puVar26 == (char)*puVar46));
          }
          uVar41 = (long)puVar46 - (long)puVar42;
        }
        unaff_R15 = uVar41 + 8;
        local_a0 = (int)puVar32;
        local_e0 = (ulong *)(ulong)(uint)((int)puVar31 - local_a0);
        if ((uVar18 < uVar30) && (src < puVar31)) {
          pBVar24 = pBVar20 + uVar30;
          puVar40 = (ulong *)((long)puVar31 + -1);
          do {
            if ((BYTE)*puVar40 != *pBVar24) goto LAB_005dce46;
            unaff_R15 = unaff_R15 + 1;
            puVar31 = (ulong *)((long)puVar40 + -1);
          } while ((pBVar39 < pBVar24) &&
                  (pBVar24 = pBVar24 + -1, bVar16 = src < puVar40, puVar40 = puVar31, bVar16));
LAB_005dc985:
          puVar40 = (ulong *)((long)puVar31 + 1);
        }
        goto LAB_005dce4c;
      }
      if ((uVar18 < uVar11) && (piVar21 = (int *)(pBVar12 + uVar11), *piVar21 == (int)*puVar31)) {
        uVar28 = *puVar42;
        uVar33 = uVar28 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
        uVar30 = pUVar13[uVar33];
        pUVar13[uVar33] = UVar44 + 1;
        iVar38 = 0;
        if ((uVar18 < uVar30) && (puVar32 = (ulong *)(pBVar12 + uVar30), *puVar32 == uVar28)) {
          puVar40 = (ulong *)((long)puVar31 + 9);
          puVar46 = puVar32 + 1;
          puVar26 = puVar40;
          if (puVar40 < puVar1) {
            uVar33 = *puVar40 ^ *puVar46;
            uVar28 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = uVar28 >> 3 & 0x1fffffff;
            if (*puVar46 == *puVar40) {
              puVar26 = (ulong *)((long)puVar31 + 0x11);
              puVar46 = puVar32 + 2;
              do {
                if (puVar1 <= puVar26) goto LAB_005dcc89;
                uVar33 = *puVar46;
                uVar36 = *puVar26;
                uVar37 = uVar36 ^ uVar33;
                uVar28 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar28 = (long)puVar26 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40);
                puVar26 = puVar26 + 1;
                puVar46 = puVar46 + 1;
              } while (uVar33 == uVar36);
            }
          }
          else {
LAB_005dcc89:
            if ((puVar26 < puVar2) && ((int)*puVar46 == (int)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 4);
              puVar46 = (ulong *)((long)puVar46 + 4);
            }
            if ((puVar26 < puVar3) && ((short)*puVar46 == (short)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 2);
              puVar46 = (ulong *)((long)puVar46 + 2);
            }
            if (puVar26 < puVar5) {
              puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar46 == (char)*puVar26));
            }
            uVar28 = (long)puVar26 - (long)puVar40;
          }
          unaff_R15 = uVar28 + 8;
          local_50 = (int)puVar32;
          local_e0 = (ulong *)(ulong)(uint)((int)puVar42 - local_50);
          iVar38 = 7;
          puVar40 = puVar42;
          if ((uVar18 < uVar30) && (src < puVar42)) {
            pBVar24 = pBVar20 + uVar30;
            while (puVar40 = puVar31, (BYTE)*puVar40 == *pBVar24) {
              unaff_R15 = unaff_R15 + 1;
              if ((pBVar24 <= pBVar39) ||
                 (pBVar24 = pBVar24 + -1, puVar31 = (ulong *)((long)puVar40 + -1), puVar40 <= src))
              goto LAB_005dcd25;
            }
            puVar40 = (ulong *)((long)puVar40 + 1);
          }
        }
LAB_005dcd25:
        if (iVar38 != 7) {
          if (iVar38 != 0) goto LAB_005dcc6f;
          puVar31 = (ulong *)((long)puVar40 + 4);
          puVar32 = (ulong *)(piVar21 + 1);
          puVar42 = puVar31;
          if (puVar31 < puVar1) {
            uVar28 = *puVar31 ^ *puVar32;
            uVar41 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
              }
            }
            uVar41 = uVar41 >> 3 & 0x1fffffff;
            if (*puVar32 == *puVar31) {
              puVar42 = (ulong *)((long)puVar40 + 0xc);
              puVar32 = (ulong *)(piVar21 + 3);
              do {
                if (puVar1 <= puVar42) goto LAB_005dcdb2;
                uVar28 = *puVar32;
                uVar33 = *puVar42;
                uVar36 = uVar33 ^ uVar28;
                uVar41 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                  }
                }
                uVar41 = (long)puVar42 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar31);
                puVar42 = puVar42 + 1;
                puVar32 = puVar32 + 1;
              } while (uVar28 == uVar33);
            }
          }
          else {
LAB_005dcdb2:
            if ((puVar42 < puVar2) && ((int)*puVar32 == (int)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 4);
              puVar32 = (ulong *)((long)puVar32 + 4);
            }
            if ((puVar42 < puVar3) && ((short)*puVar32 == (short)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 2);
              puVar32 = (ulong *)((long)puVar32 + 2);
            }
            if (puVar42 < puVar5) {
              puVar42 = (ulong *)((long)puVar42 + (ulong)((char)*puVar32 == (char)*puVar42));
            }
            uVar41 = (long)puVar42 - (long)puVar31;
          }
          unaff_R15 = uVar41 + 4;
          local_a0 = (int)piVar21;
          local_e0 = (ulong *)(ulong)(uint)((int)puVar40 - local_a0);
          if ((uVar18 < uVar11) && (src < puVar40)) {
            pBVar24 = pBVar20 + uVar11;
            puVar40 = (ulong *)((long)puVar40 + -1);
            do {
              if ((BYTE)*puVar40 != *pBVar24) goto LAB_005dce46;
              unaff_R15 = unaff_R15 + 1;
              puVar31 = (ulong *)((long)puVar40 + -1);
            } while ((pBVar39 < pBVar24) &&
                    (pBVar24 = pBVar24 + -1, bVar16 = src < puVar40, puVar40 = puVar31, bVar16));
            goto LAB_005dc985;
          }
        }
        goto LAB_005dce4c;
      }
      puVar40 = (ulong *)((long)puVar31 + ((long)puVar31 - (long)src >> 8) + 1);
      goto LAB_005dcc6f;
    }
  }
  else if (puVar31 < puVar9) {
    bVar22 = 0x40 - (char)(ms->cParams).hashLog;
    bVar23 = 0x20 - (char)(ms->cParams).chainLog;
    puVar1 = (ulong *)((long)puVar5 - 7);
    puVar2 = (ulong *)((long)puVar5 - 3);
    puVar3 = (ulong *)((long)puVar5 - 1);
    puVar19 = puVar5 + -4;
    ppsVar4 = &seqStore->sequences;
    pBVar24 = pBVar12 + -1;
    pBVar20 = pBVar24;
    local_98 = puVar3;
LAB_005de58e:
    uVar28 = *puVar31 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
    uVar35 = (uint)((int)*puVar31 * -0x61c8864f) >> (bVar23 & 0x1f);
    UVar44 = (int)puVar31 - iVar34;
    uVar30 = pUVar13[uVar28];
    uVar11 = pUVar14[uVar35];
    pUVar14[uVar35] = UVar44;
    pUVar13[uVar28] = UVar44;
    puVar42 = (ulong *)((long)puVar31 + 1);
    uVar35 = (uint)uVar41;
    if ((uVar35 != 0) && (*(int *)((long)puVar42 - uVar41) == *(int *)((long)puVar31 + 1))) {
      puVar40 = (ulong *)((long)puVar31 + 5);
      puVar46 = (ulong *)((long)puVar31 + (5 - uVar41));
      puVar32 = puVar40;
      if (puVar40 < puVar1) {
        uVar33 = *puVar40 ^ *puVar46;
        uVar28 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = uVar28 >> 3 & 0x1fffffff;
        if (*puVar46 == *puVar40) {
          puVar32 = (ulong *)((long)puVar31 + 0xd);
          puVar46 = (ulong *)((long)puVar31 + (0xd - uVar41));
          do {
            if (puVar1 <= puVar32) goto LAB_005de822;
            uVar33 = *puVar46;
            uVar36 = *puVar32;
            uVar37 = uVar36 ^ uVar33;
            uVar28 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = (long)puVar32 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40);
            puVar32 = puVar32 + 1;
            puVar46 = puVar46 + 1;
          } while (uVar33 == uVar36);
        }
      }
      else {
LAB_005de822:
        if ((puVar32 < puVar2) && ((int)*puVar46 == (int)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 4);
          puVar46 = (ulong *)((long)puVar46 + 4);
        }
        if ((puVar32 < puVar3) && ((short)*puVar46 == (short)*puVar32)) {
          puVar32 = (ulong *)((long)puVar32 + 2);
          puVar46 = (ulong *)((long)puVar46 + 2);
        }
        if (puVar32 < puVar5) {
          puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar46 == (char)*puVar32));
        }
        uVar28 = (long)puVar32 - (long)puVar40;
      }
      uVar33 = (long)puVar42 - (long)src;
      if (puVar19 < puVar42) {
        puVar40 = (ulong *)seqStore->lit;
        puVar31 = puVar40;
        puVar32 = (ulong *)src;
        if (src <= puVar19) {
          puVar31 = (ulong *)((long)puVar40 + ((long)puVar19 - (long)src));
          uVar36 = *(ulong *)((long)src + 8);
          *puVar40 = *src;
          puVar40[1] = uVar36;
          puVar32 = puVar19;
          if (0x10 < (long)puVar19 - (long)src) {
            lVar47 = 0x10;
            do {
              uVar17 = ((undefined8 *)((long)src + lVar47))[1];
              puVar6 = (undefined8 *)((long)puVar40 + lVar47);
              *puVar6 = *(undefined8 *)((long)src + lVar47);
              puVar6[1] = uVar17;
              puVar7 = (undefined8 *)((long)src + lVar47 + 0x10);
              uVar17 = puVar7[1];
              puVar6[2] = *puVar7;
              puVar6[3] = uVar17;
              lVar47 = lVar47 + 0x20;
            } while (puVar6 + 4 < puVar31);
          }
        }
        if (puVar32 < puVar42) {
          lVar47 = 0;
          do {
            *(undefined1 *)((long)puVar31 + lVar47) = *(undefined1 *)((long)puVar32 + lVar47);
            lVar47 = lVar47 + 1;
          } while ((long)puVar42 - (long)puVar32 != lVar47);
        }
      }
      else {
        puVar31 = (ulong *)seqStore->lit;
        uVar36 = *(ulong *)((long)src + 8);
        *puVar31 = *src;
        puVar31[1] = uVar36;
        if (0x10 < uVar33) {
          pBVar20 = seqStore->lit;
          uVar36 = *(ulong *)((long)src + 0x18);
          *(ulong *)(pBVar20 + 0x10) = *(ulong *)((long)src + 0x10);
          *(ulong *)(pBVar20 + 0x18) = uVar36;
          if (0x20 < (long)uVar33) {
            lVar47 = 0;
            do {
              puVar6 = (undefined8 *)((long)src + lVar47 + 0x20);
              uVar17 = puVar6[1];
              pBVar25 = pBVar20 + lVar47 + 0x20;
              *(undefined8 *)pBVar25 = *puVar6;
              *(undefined8 *)(pBVar25 + 8) = uVar17;
              puVar6 = (undefined8 *)((long)src + lVar47 + 0x30);
              uVar17 = puVar6[1];
              *(undefined8 *)(pBVar25 + 0x10) = *puVar6;
              *(undefined8 *)(pBVar25 + 0x18) = uVar17;
              lVar47 = lVar47 + 0x20;
            } while (pBVar25 + 0x20 < pBVar20 + uVar33);
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar33;
      if (0xffff < uVar33) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      pBVar20 = (BYTE *)(uVar28 + 4);
      pBVar25 = (BYTE *)(uVar28 + 1);
      psVar15 = *ppsVar4;
      psVar15->litLength = (U16)uVar33;
      psVar15->offset = 1;
      puVar40 = puVar42;
      uVar30 = uVar35;
      uVar35 = uVar45;
      goto joined_r0x005de99a;
    }
    puVar40 = puVar31;
    if ((uVar18 < uVar30) && (puVar32 = (ulong *)(pBVar12 + uVar30), *puVar32 == *puVar31)) {
      puVar42 = puVar31 + 1;
      puVar26 = puVar32 + 1;
      puVar46 = puVar42;
      if (puVar42 < puVar1) {
        uVar28 = *puVar42 ^ *puVar26;
        uVar41 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
        uVar41 = uVar41 >> 3 & 0x1fffffff;
        if (*puVar26 == *puVar42) {
          puVar46 = puVar31 + 2;
          puVar26 = puVar32 + 2;
          do {
            if (puVar1 <= puVar46) goto LAB_005debfd;
            uVar28 = *puVar26;
            uVar33 = *puVar46;
            uVar36 = uVar33 ^ uVar28;
            uVar41 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
              }
            }
            uVar41 = (long)puVar46 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar42);
            puVar46 = puVar46 + 1;
            puVar26 = puVar26 + 1;
          } while (uVar28 == uVar33);
        }
      }
      else {
LAB_005debfd:
        if ((puVar46 < puVar2) && ((int)*puVar26 == (int)*puVar46)) {
          puVar46 = (ulong *)((long)puVar46 + 4);
          puVar26 = (ulong *)((long)puVar26 + 4);
        }
        if ((puVar46 < puVar3) && ((short)*puVar26 == (short)*puVar46)) {
          puVar46 = (ulong *)((long)puVar46 + 2);
          puVar26 = (ulong *)((long)puVar26 + 2);
        }
        if (puVar46 < puVar5) {
          puVar46 = (ulong *)((long)puVar46 + (ulong)((char)*puVar26 == (char)*puVar46));
        }
        uVar41 = (long)puVar46 - (long)puVar42;
      }
      pBVar20 = (BYTE *)(uVar41 + 8);
      local_d8 = (int)puVar32;
      local_98 = (ulong *)(ulong)(uint)((int)puVar31 - local_d8);
      if ((uVar18 < uVar30) && (src < puVar31)) {
        pBVar25 = pBVar24 + uVar30;
        puVar40 = (ulong *)((long)puVar31 + -1);
        do {
          if ((BYTE)*puVar40 != *pBVar25) goto LAB_005dee85;
          pBVar20 = pBVar20 + 1;
          puVar31 = (ulong *)((long)puVar40 + -1);
        } while ((pBVar39 < pBVar25) &&
                (pBVar25 = pBVar25 + -1, bVar16 = src < puVar40, puVar40 = puVar31, bVar16));
LAB_005dec98:
        puVar40 = (ulong *)((long)puVar31 + 1);
      }
      goto LAB_005dee8b;
    }
    if ((uVar18 < uVar11) && (piVar21 = (int *)(pBVar12 + uVar11), *piVar21 == (int)*puVar31)) {
      uVar28 = *puVar42;
      uVar33 = uVar28 * -0x30e44323485a9b9d >> (bVar22 & 0x3f);
      uVar30 = pUVar13[uVar33];
      pUVar13[uVar33] = UVar44 + 1;
      iVar38 = 0;
      if ((uVar18 < uVar30) && (puVar32 = (ulong *)(pBVar12 + uVar30), *puVar32 == uVar28)) {
        puVar40 = (ulong *)((long)puVar31 + 9);
        puVar46 = puVar32 + 1;
        puVar26 = puVar40;
        if (puVar40 < puVar1) {
          uVar33 = *puVar40 ^ *puVar46;
          uVar28 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = uVar28 >> 3 & 0x1fffffff;
          if (*puVar46 == *puVar40) {
            puVar26 = (ulong *)((long)puVar31 + 0x11);
            puVar46 = puVar32 + 2;
            do {
              if (puVar1 <= puVar26) goto LAB_005decad;
              uVar33 = *puVar46;
              uVar36 = *puVar26;
              uVar37 = uVar36 ^ uVar33;
              uVar28 = 0;
              if (uVar37 != 0) {
                for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (long)puVar26 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar40);
              puVar26 = puVar26 + 1;
              puVar46 = puVar46 + 1;
            } while (uVar33 == uVar36);
          }
        }
        else {
LAB_005decad:
          if ((puVar26 < puVar2) && ((int)*puVar46 == (int)*puVar26)) {
            puVar26 = (ulong *)((long)puVar26 + 4);
            puVar46 = (ulong *)((long)puVar46 + 4);
          }
          if ((puVar26 < puVar3) && ((short)*puVar46 == (short)*puVar26)) {
            puVar26 = (ulong *)((long)puVar26 + 2);
            puVar46 = (ulong *)((long)puVar46 + 2);
          }
          if (puVar26 < puVar5) {
            puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar46 == (char)*puVar26));
          }
          uVar28 = (long)puVar26 - (long)puVar40;
        }
        pBVar20 = (BYTE *)(uVar28 + 8);
        local_a0 = (int)puVar32;
        local_98 = (ulong *)(ulong)(uint)((int)puVar42 - local_a0);
        iVar38 = 7;
        puVar40 = puVar42;
        if ((uVar18 < uVar30) && (src < puVar42)) {
          pBVar25 = pBVar24 + uVar30;
          while (puVar40 = puVar31, (BYTE)*puVar40 == *pBVar25) {
            pBVar20 = pBVar20 + 1;
            if ((pBVar25 <= pBVar39) ||
               (pBVar25 = pBVar25 + -1, puVar31 = (ulong *)((long)puVar40 + -1), puVar40 <= src))
            goto LAB_005ded66;
          }
          puVar40 = (ulong *)((long)puVar40 + 1);
        }
      }
LAB_005ded66:
      if (iVar38 != 7) {
        if (iVar38 != 0) goto LAB_005debea;
        puVar31 = (ulong *)((long)puVar40 + 4);
        puVar32 = (ulong *)(piVar21 + 1);
        puVar42 = puVar31;
        if (puVar31 < puVar1) {
          uVar28 = *puVar31 ^ *puVar32;
          uVar41 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
            }
          }
          uVar41 = uVar41 >> 3 & 0x1fffffff;
          if (*puVar32 == *puVar31) {
            puVar42 = (ulong *)((long)puVar40 + 0xc);
            puVar32 = (ulong *)(piVar21 + 3);
            do {
              if (puVar1 <= puVar42) goto LAB_005deded;
              uVar28 = *puVar32;
              uVar33 = *puVar42;
              uVar36 = uVar33 ^ uVar28;
              uVar41 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                }
              }
              uVar41 = (long)puVar42 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar31);
              puVar42 = puVar42 + 1;
              puVar32 = puVar32 + 1;
            } while (uVar28 == uVar33);
          }
        }
        else {
LAB_005deded:
          if ((puVar42 < puVar2) && ((int)*puVar32 == (int)*puVar42)) {
            puVar42 = (ulong *)((long)puVar42 + 4);
            puVar32 = (ulong *)((long)puVar32 + 4);
          }
          if ((puVar42 < puVar3) && ((short)*puVar32 == (short)*puVar42)) {
            puVar42 = (ulong *)((long)puVar42 + 2);
            puVar32 = (ulong *)((long)puVar32 + 2);
          }
          if (puVar42 < puVar5) {
            puVar42 = (ulong *)((long)puVar42 + (ulong)((char)*puVar32 == (char)*puVar42));
          }
          uVar41 = (long)puVar42 - (long)puVar31;
        }
        pBVar20 = (BYTE *)(uVar41 + 4);
        base._0_4_ = (int)piVar21;
        local_98 = (ulong *)(ulong)(uint)((int)puVar40 - (int)base);
        if ((uVar18 < uVar11) && (src < puVar40)) {
          pBVar25 = pBVar24 + uVar11;
          puVar40 = (ulong *)((long)puVar40 + -1);
          do {
            if ((BYTE)*puVar40 != *pBVar25) goto LAB_005dee85;
            pBVar20 = pBVar20 + 1;
            puVar31 = (ulong *)((long)puVar40 + -1);
          } while ((pBVar39 < pBVar25) &&
                  (pBVar25 = pBVar25 + -1, bVar16 = src < puVar40, puVar40 = puVar31, bVar16));
          goto LAB_005dec98;
        }
      }
      goto LAB_005dee8b;
    }
    puVar40 = (ulong *)((long)puVar31 + ((long)puVar31 - (long)src >> 8) + 1);
    goto LAB_005debea;
  }
LAB_005defc6:
  uVar18 = 0;
  if (uVar43 < uVar27) {
    uVar18 = uVar27;
  }
  if (uVar43 < uVar10) {
    uVar18 = uVar10;
  }
  if (uVar30 == 0) {
    uVar30 = uVar18;
  }
  if (uVar45 != 0) {
    uVar18 = uVar45;
  }
  *rep = uVar30;
  rep[1] = uVar18;
  return (long)puVar5 - (long)src;
LAB_005de3c9:
  puVar40 = (ulong *)((long)puVar40 + 1);
LAB_005de3cf:
  uVar41 = (long)puVar40 - (long)src;
  if (puVar19 < puVar40) {
    puVar42 = (ulong *)seqStore->lit;
    puVar31 = puVar42;
    puVar32 = (ulong *)src;
    if (src <= puVar19) {
      puVar31 = (ulong *)((long)puVar42 + ((long)puVar19 - (long)src));
      uVar28 = *(ulong *)((long)src + 8);
      *puVar42 = *src;
      puVar42[1] = uVar28;
      puVar32 = puVar19;
      if (0x10 < (long)puVar19 - (long)src) {
        lVar47 = 0x10;
        do {
          uVar17 = ((undefined8 *)((long)src + lVar47))[1];
          puVar6 = (undefined8 *)((long)puVar42 + lVar47);
          *puVar6 = *(undefined8 *)((long)src + lVar47);
          puVar6[1] = uVar17;
          puVar7 = (undefined8 *)((long)src + lVar47 + 0x10);
          uVar17 = puVar7[1];
          puVar6[2] = *puVar7;
          puVar6[3] = uVar17;
          lVar47 = lVar47 + 0x20;
        } while (puVar6 + 4 < puVar31);
      }
    }
    if (puVar32 < puVar40) {
      lVar47 = 0;
      do {
        *(undefined1 *)((long)puVar31 + lVar47) = *(undefined1 *)((long)puVar32 + lVar47);
        lVar47 = lVar47 + 1;
      } while ((long)puVar40 - (long)puVar32 != lVar47);
    }
  }
  else {
    puVar31 = (ulong *)seqStore->lit;
    uVar28 = *(ulong *)((long)src + 8);
    *puVar31 = *src;
    puVar31[1] = uVar28;
    if (0x10 < uVar41) {
      pBVar24 = seqStore->lit;
      uVar28 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar24 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar24 + 0x18) = uVar28;
      if (0x20 < (long)uVar41) {
        lVar47 = 0;
        do {
          puVar6 = (undefined8 *)((long)src + lVar47 + 0x20);
          uVar17 = puVar6[1];
          pBVar25 = pBVar24 + lVar47 + 0x20;
          *(undefined8 *)pBVar25 = *puVar6;
          *(undefined8 *)(pBVar25 + 8) = uVar17;
          puVar6 = (undefined8 *)((long)src + lVar47 + 0x30);
          uVar17 = puVar6[1];
          *(undefined8 *)(pBVar25 + 0x10) = *puVar6;
          *(undefined8 *)(pBVar25 + 0x18) = uVar17;
          lVar47 = lVar47 + 0x20;
        } while (pBVar25 + 0x20 < pBVar24 + uVar41);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar41;
  if (0xffff < uVar41) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  uVar28 = unaff_R15 - 3;
  psVar15 = *ppsVar4;
  psVar15->litLength = (U16)uVar41;
  uVar30 = (uint)local_e0;
  psVar15->offset = uVar30 + 3;
  uVar41 = (ulong)local_e0 & 0xffffffff;
joined_r0x005ddfac:
  if (0xffff < uVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
    uVar41 = (ulong)uVar30;
  }
  psVar15->matchLength = (U16)uVar28;
  *ppsVar4 = psVar15 + 1;
  puVar40 = (ulong *)((long)puVar40 + unaff_R15);
  src = puVar40;
  uVar45 = uVar35;
  if (puVar40 <= puVar9) {
    uVar45 = UVar44 + 2;
    lVar47 = *(long *)(pBVar12 + uVar45);
    pUVar13[(ulong)(lVar47 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar45;
    pUVar13[(ulong)(*(long *)((long)puVar40 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar40 + -2) - iVar34;
    pUVar14[(ulong)(lVar47 * -0x30e4432345000000) >> (bVar23 & 0x3f)] = uVar45;
    pUVar14[(ulong)(*(long *)((long)puVar40 + -1) * -0x30e4432345000000) >> (bVar23 & 0x3f)] =
         ((int)puVar40 + -1) - iVar34;
    uVar28 = (ulong)uVar35;
    do {
      uVar33 = uVar28;
      uVar45 = (uint)uVar33;
      uVar30 = (uint)uVar41;
      src = puVar40;
      if ((uVar45 == 0) || ((int)*puVar40 != *(int *)((long)puVar40 - uVar33))) break;
      puVar31 = (ulong *)((long)puVar40 + 4);
      puVar32 = (ulong *)((long)puVar40 + (4 - uVar33));
      puVar42 = puVar31;
      if (puVar31 < puVar1) {
        uVar36 = *puVar31 ^ *puVar32;
        uVar28 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = uVar28 >> 3 & 0x1fffffff;
        if (*puVar32 == *puVar31) {
          puVar42 = (ulong *)((long)puVar40 + 0xc);
          puVar32 = (ulong *)((long)puVar40 + (0xc - uVar33));
          do {
            if (puVar1 <= puVar42) goto LAB_005de0ee;
            uVar36 = *puVar32;
            uVar37 = *puVar42;
            uVar29 = uVar37 ^ uVar36;
            uVar28 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = (long)puVar42 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar31);
            puVar42 = puVar42 + 1;
            puVar32 = puVar32 + 1;
          } while (uVar36 == uVar37);
        }
      }
      else {
LAB_005de0ee:
        if ((puVar42 < puVar2) && ((int)*puVar32 == (int)*puVar42)) {
          puVar42 = (ulong *)((long)puVar42 + 4);
          puVar32 = (ulong *)((long)puVar32 + 4);
        }
        if ((puVar42 < puVar3) && ((short)*puVar32 == (short)*puVar42)) {
          puVar42 = (ulong *)((long)puVar42 + 2);
          puVar32 = (ulong *)((long)puVar32 + 2);
        }
        if (puVar42 < puVar5) {
          puVar42 = (ulong *)((long)puVar42 + (ulong)((char)*puVar32 == (char)*puVar42));
        }
        uVar28 = (long)puVar42 - (long)puVar31;
      }
      uVar36 = *puVar40;
      UVar44 = (int)puVar40 - iVar34;
      pUVar14[uVar36 * -0x30e4432345000000 >> (bVar23 & 0x3f)] = UVar44;
      pUVar13[uVar36 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar44;
      if (puVar40 <= puVar19) {
        puVar31 = (ulong *)seqStore->lit;
        uVar36 = puVar40[1];
        *puVar31 = *puVar40;
        puVar31[1] = uVar36;
      }
      psVar15 = seqStore->sequences;
      psVar15->litLength = 0;
      psVar15->offset = 1;
      if (0xffff < uVar28 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar15->matchLength = (U16)(uVar28 + 1);
      seqStore->sequences = psVar15 + 1;
      puVar40 = (ulong *)((long)puVar40 + uVar28 + 4);
      uVar28 = uVar41;
      src = puVar40;
      uVar41 = uVar33;
      uVar45 = uVar30;
    } while (puVar40 <= puVar9);
  }
LAB_005de1f2:
  uVar30 = (uint)uVar41;
  puVar31 = puVar40;
  if (puVar9 <= puVar40) goto LAB_005defc6;
  goto LAB_005ddac2;
LAB_005dd914:
  puVar40 = (ulong *)((long)puVar40 + 1);
LAB_005dd91a:
  uVar41 = (long)puVar40 - (long)src;
  if (puVar19 < puVar40) {
    puVar42 = (ulong *)seqStore->lit;
    puVar31 = puVar42;
    puVar32 = (ulong *)src;
    if (src <= puVar19) {
      puVar31 = (ulong *)((long)puVar42 + ((long)puVar19 - (long)src));
      uVar28 = *(ulong *)((long)src + 8);
      *puVar42 = *src;
      puVar42[1] = uVar28;
      puVar32 = puVar19;
      if (0x10 < (long)puVar19 - (long)src) {
        lVar47 = 0x10;
        do {
          uVar17 = ((undefined8 *)((long)src + lVar47))[1];
          puVar6 = (undefined8 *)((long)puVar42 + lVar47);
          *puVar6 = *(undefined8 *)((long)src + lVar47);
          puVar6[1] = uVar17;
          puVar7 = (undefined8 *)((long)src + lVar47 + 0x10);
          uVar17 = puVar7[1];
          puVar6[2] = *puVar7;
          puVar6[3] = uVar17;
          lVar47 = lVar47 + 0x20;
        } while (puVar6 + 4 < puVar31);
      }
    }
    if (puVar32 < puVar40) {
      lVar47 = 0;
      do {
        *(undefined1 *)((long)puVar31 + lVar47) = *(undefined1 *)((long)puVar32 + lVar47);
        lVar47 = lVar47 + 1;
      } while ((long)puVar40 - (long)puVar32 != lVar47);
    }
  }
  else {
    puVar31 = (ulong *)seqStore->lit;
    uVar28 = *(ulong *)((long)src + 8);
    *puVar31 = *src;
    puVar31[1] = uVar28;
    if (0x10 < uVar41) {
      pBVar25 = seqStore->lit;
      uVar28 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar25 + 0x18) = uVar28;
      if (0x20 < (long)uVar41) {
        lVar47 = 0;
        do {
          puVar6 = (undefined8 *)((long)src + lVar47 + 0x20);
          uVar17 = puVar6[1];
          pBVar8 = pBVar25 + lVar47 + 0x20;
          *(undefined8 *)pBVar8 = *puVar6;
          *(undefined8 *)(pBVar8 + 8) = uVar17;
          puVar6 = (undefined8 *)((long)src + lVar47 + 0x30);
          uVar17 = puVar6[1];
          *(undefined8 *)(pBVar8 + 0x10) = *puVar6;
          *(undefined8 *)(pBVar8 + 0x18) = uVar17;
          lVar47 = lVar47 + 0x20;
        } while (pBVar8 + 0x20 < pBVar25 + uVar41);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar41;
  if (0xffff < uVar41) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar25 = pBVar20 + -3;
  psVar15 = *ppsVar4;
  psVar15->litLength = (U16)uVar41;
  uVar30 = (uint)local_e0;
  psVar15->offset = uVar30 + 3;
  uVar41 = (ulong)local_e0 & 0xffffffff;
  uVar45 = uVar35;
joined_r0x005dd424:
  if ((BYTE *)0xffff < pBVar25) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
    uVar41 = (ulong)uVar30;
  }
  psVar15->matchLength = (U16)pBVar25;
  *ppsVar4 = psVar15 + 1;
  puVar40 = (ulong *)((long)puVar40 + (long)pBVar20);
  src = puVar40;
  if (puVar40 <= puVar9) {
    uVar30 = UVar44 + 2;
    lVar47 = *(long *)(pBVar12 + uVar30);
    pUVar13[(ulong)(lVar47 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar30;
    pUVar13[(ulong)(*(long *)((long)puVar40 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar40 + -2) - iVar34;
    pUVar14[(ulong)(lVar47 * -0x30e4432340650000) >> (bVar23 & 0x3f)] = uVar30;
    pUVar14[(ulong)(*(long *)((long)puVar40 + -1) * -0x30e4432340650000) >> (bVar23 & 0x3f)] =
         ((int)puVar40 + -1) - iVar34;
    uVar30 = uVar45;
    do {
      uVar45 = uVar30;
      uVar30 = (uint)uVar41;
      src = puVar40;
      if ((uVar45 == 0) ||
         (uVar28 = (ulong)uVar45, (int)*puVar40 != *(int *)((long)puVar40 - uVar28)))
      goto LAB_005dd685;
      puVar31 = (ulong *)((long)puVar40 + 4);
      puVar32 = (ulong *)((long)puVar40 + (4 - uVar28));
      puVar42 = puVar31;
      if (puVar31 < puVar1) {
        uVar33 = *puVar31 ^ *puVar32;
        uVar41 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
        uVar41 = uVar41 >> 3 & 0x1fffffff;
        if (*puVar32 == *puVar31) {
          puVar42 = (ulong *)((long)puVar40 + 0xc);
          puVar32 = (ulong *)((long)puVar40 + (0xc - uVar28));
          do {
            if (puVar1 <= puVar42) goto LAB_005dd581;
            uVar28 = *puVar32;
            uVar33 = *puVar42;
            uVar36 = uVar33 ^ uVar28;
            uVar41 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
              }
            }
            uVar41 = (long)puVar42 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar31);
            puVar42 = puVar42 + 1;
            puVar32 = puVar32 + 1;
          } while (uVar28 == uVar33);
        }
      }
      else {
LAB_005dd581:
        if ((puVar42 < puVar2) && ((int)*puVar32 == (int)*puVar42)) {
          puVar42 = (ulong *)((long)puVar42 + 4);
          puVar32 = (ulong *)((long)puVar32 + 4);
        }
        if ((puVar42 < puVar3) && ((short)*puVar32 == (short)*puVar42)) {
          puVar42 = (ulong *)((long)puVar42 + 2);
          puVar32 = (ulong *)((long)puVar32 + 2);
        }
        if (puVar42 < puVar5) {
          puVar42 = (ulong *)((long)puVar42 + (ulong)((char)*puVar32 == (char)*puVar42));
        }
        uVar41 = (long)puVar42 - (long)puVar31;
      }
      uVar28 = *puVar40;
      UVar44 = (int)puVar40 - iVar34;
      pUVar14[uVar28 * -0x30e4432340650000 >> (bVar23 & 0x3f)] = UVar44;
      pUVar13[uVar28 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar44;
      if (puVar40 <= puVar19) {
        puVar31 = (ulong *)seqStore->lit;
        uVar28 = puVar40[1];
        *puVar31 = *puVar40;
        puVar31[1] = uVar28;
      }
      psVar15 = seqStore->sequences;
      psVar15->litLength = 0;
      psVar15->offset = 1;
      if (0xffff < uVar41 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar15->matchLength = (U16)(uVar41 + 1);
      seqStore->sequences = psVar15 + 1;
      puVar40 = (ulong *)((long)puVar40 + uVar41 + 4);
      uVar41 = (ulong)uVar45;
    } while (puVar40 <= puVar9);
    uVar41 = (ulong)uVar45;
    src = puVar40;
    uVar45 = uVar30;
  }
LAB_005dd685:
  uVar30 = (uint)uVar41;
  puVar31 = puVar40;
  if (puVar9 <= puVar40) goto LAB_005defc6;
  goto LAB_005dd016;
LAB_005dee85:
  puVar40 = (ulong *)((long)puVar40 + 1);
LAB_005dee8b:
  uVar41 = (long)puVar40 - (long)src;
  if (puVar19 < puVar40) {
    puVar42 = (ulong *)seqStore->lit;
    puVar31 = puVar42;
    puVar32 = (ulong *)src;
    if (src <= puVar19) {
      puVar31 = (ulong *)((long)puVar42 + ((long)puVar19 - (long)src));
      uVar28 = *(ulong *)((long)src + 8);
      *puVar42 = *src;
      puVar42[1] = uVar28;
      puVar32 = puVar19;
      if (0x10 < (long)puVar19 - (long)src) {
        lVar47 = 0x10;
        do {
          uVar17 = ((undefined8 *)((long)src + lVar47))[1];
          puVar6 = (undefined8 *)((long)puVar42 + lVar47);
          *puVar6 = *(undefined8 *)((long)src + lVar47);
          puVar6[1] = uVar17;
          puVar7 = (undefined8 *)((long)src + lVar47 + 0x10);
          uVar17 = puVar7[1];
          puVar6[2] = *puVar7;
          puVar6[3] = uVar17;
          lVar47 = lVar47 + 0x20;
        } while (puVar6 + 4 < puVar31);
      }
    }
    if (puVar32 < puVar40) {
      lVar47 = 0;
      do {
        *(undefined1 *)((long)puVar31 + lVar47) = *(undefined1 *)((long)puVar32 + lVar47);
        lVar47 = lVar47 + 1;
      } while ((long)puVar40 - (long)puVar32 != lVar47);
    }
  }
  else {
    puVar31 = (ulong *)seqStore->lit;
    uVar28 = *(ulong *)((long)src + 8);
    *puVar31 = *src;
    puVar31[1] = uVar28;
    if (0x10 < uVar41) {
      pBVar25 = seqStore->lit;
      uVar28 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar25 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar25 + 0x18) = uVar28;
      if (0x20 < (long)uVar41) {
        lVar47 = 0;
        do {
          puVar6 = (undefined8 *)((long)src + lVar47 + 0x20);
          uVar17 = puVar6[1];
          pBVar8 = pBVar25 + lVar47 + 0x20;
          *(undefined8 *)pBVar8 = *puVar6;
          *(undefined8 *)(pBVar8 + 8) = uVar17;
          puVar6 = (undefined8 *)((long)src + lVar47 + 0x30);
          uVar17 = puVar6[1];
          *(undefined8 *)(pBVar8 + 0x10) = *puVar6;
          *(undefined8 *)(pBVar8 + 0x18) = uVar17;
          lVar47 = lVar47 + 0x20;
        } while (pBVar8 + 0x20 < pBVar25 + uVar41);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar41;
  if (0xffff < uVar41) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar25 = pBVar20 + -3;
  psVar15 = *ppsVar4;
  psVar15->litLength = (U16)uVar41;
  uVar30 = (uint)local_98;
  psVar15->offset = uVar30 + 3;
  uVar41 = (ulong)local_98 & 0xffffffff;
joined_r0x005de99a:
  if ((BYTE *)0xffff < pBVar25) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
    uVar41 = (ulong)uVar30;
  }
  psVar15->matchLength = (U16)pBVar25;
  *ppsVar4 = psVar15 + 1;
  puVar40 = (ulong *)((long)puVar40 + (long)pBVar20);
  src = puVar40;
  uVar45 = uVar35;
  if (puVar40 <= puVar9) {
    uVar45 = UVar44 + 2;
    pUVar13[(ulong)(*(long *)(pBVar12 + uVar45) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar45;
    pUVar13[(ulong)(*(long *)((long)puVar40 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar40 + -2) - iVar34;
    pUVar14[(uint)(*(int *)(pBVar12 + uVar45) * -0x61c8864f) >> (bVar23 & 0x1f)] = uVar45;
    pUVar14[(uint)(*(int *)((long)puVar40 + -1) * -0x61c8864f) >> (bVar23 & 0x1f)] =
         ((int)puVar40 + -1) - iVar34;
    do {
      uVar45 = uVar35;
      uVar35 = (uint)uVar41;
      src = puVar40;
      if (uVar45 == 0) goto LAB_005debea;
      uVar28 = (ulong)uVar45;
      if ((int)*puVar40 != *(int *)((long)puVar40 - uVar28)) goto LAB_005debea;
      puVar31 = (ulong *)((long)puVar40 + 4);
      puVar32 = (ulong *)((long)puVar40 + (4 - uVar28));
      puVar42 = puVar31;
      if (puVar31 < puVar1) {
        uVar33 = *puVar31 ^ *puVar32;
        uVar41 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
          }
        }
        uVar41 = uVar41 >> 3 & 0x1fffffff;
        if (*puVar32 == *puVar31) {
          puVar42 = (ulong *)((long)puVar40 + 0xc);
          puVar32 = (ulong *)((long)puVar40 + (0xc - uVar28));
          do {
            if (puVar1 <= puVar42) goto LAB_005deade;
            uVar28 = *puVar32;
            uVar33 = *puVar42;
            uVar36 = uVar33 ^ uVar28;
            uVar41 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
              }
            }
            uVar41 = (long)puVar42 + ((uVar41 >> 3 & 0x1fffffff) - (long)puVar31);
            puVar42 = puVar42 + 1;
            puVar32 = puVar32 + 1;
          } while (uVar28 == uVar33);
        }
      }
      else {
LAB_005deade:
        if ((puVar42 < puVar2) && ((int)*puVar32 == (int)*puVar42)) {
          puVar42 = (ulong *)((long)puVar42 + 4);
          puVar32 = (ulong *)((long)puVar32 + 4);
        }
        if ((puVar42 < puVar3) && ((short)*puVar32 == (short)*puVar42)) {
          puVar42 = (ulong *)((long)puVar42 + 2);
          puVar32 = (ulong *)((long)puVar32 + 2);
        }
        if (puVar42 < puVar5) {
          puVar42 = (ulong *)((long)puVar42 + (ulong)((char)*puVar32 == (char)*puVar42));
        }
        uVar41 = (long)puVar42 - (long)puVar31;
      }
      UVar44 = (int)puVar40 - iVar34;
      pUVar14[(uint)((int)*puVar40 * -0x61c8864f) >> (bVar23 & 0x1f)] = UVar44;
      pUVar13[*puVar40 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar44;
      if (puVar40 <= puVar19) {
        puVar31 = (ulong *)seqStore->lit;
        uVar28 = puVar40[1];
        *puVar31 = *puVar40;
        puVar31[1] = uVar28;
      }
      psVar15 = seqStore->sequences;
      psVar15->litLength = 0;
      psVar15->offset = 1;
      if (0xffff < uVar41 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar15->matchLength = (U16)(uVar41 + 1);
      seqStore->sequences = psVar15 + 1;
      puVar40 = (ulong *)((long)puVar40 + uVar41 + 4);
      uVar41 = (ulong)uVar45;
    } while (puVar40 <= puVar9);
    uVar41 = (ulong)uVar45;
    src = puVar40;
    uVar45 = uVar35;
  }
LAB_005debea:
  uVar30 = (uint)uVar41;
  puVar31 = puVar40;
  if (puVar9 <= puVar40) goto LAB_005defc6;
  goto LAB_005de58e;
LAB_005dce46:
  puVar40 = (ulong *)((long)puVar40 + 1);
LAB_005dce4c:
  uVar41 = (long)puVar40 - (long)src;
  if (puVar19 < puVar40) {
    puVar42 = (ulong *)seqStore->lit;
    puVar31 = puVar42;
    puVar32 = (ulong *)src;
    if (src <= puVar19) {
      puVar31 = (ulong *)((long)puVar42 + ((long)puVar19 - (long)src));
      uVar28 = *(ulong *)((long)src + 8);
      *puVar42 = *src;
      puVar42[1] = uVar28;
      puVar32 = puVar19;
      if (0x10 < (long)puVar19 - (long)src) {
        lVar47 = 0x10;
        do {
          uVar17 = ((undefined8 *)((long)src + lVar47))[1];
          puVar6 = (undefined8 *)((long)puVar42 + lVar47);
          *puVar6 = *(undefined8 *)((long)src + lVar47);
          puVar6[1] = uVar17;
          puVar7 = (undefined8 *)((long)src + lVar47 + 0x10);
          uVar17 = puVar7[1];
          puVar6[2] = *puVar7;
          puVar6[3] = uVar17;
          lVar47 = lVar47 + 0x20;
        } while (puVar6 + 4 < puVar31);
      }
    }
    if (puVar32 < puVar40) {
      lVar47 = 0;
      do {
        *(undefined1 *)((long)puVar31 + lVar47) = *(undefined1 *)((long)puVar32 + lVar47);
        lVar47 = lVar47 + 1;
      } while ((long)puVar40 - (long)puVar32 != lVar47);
    }
  }
  else {
    puVar31 = (ulong *)seqStore->lit;
    uVar28 = *(ulong *)((long)src + 8);
    *puVar31 = *src;
    puVar31[1] = uVar28;
    if (0x10 < uVar41) {
      pBVar24 = seqStore->lit;
      uVar28 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar24 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar24 + 0x18) = uVar28;
      if (0x20 < (long)uVar41) {
        lVar47 = 0;
        do {
          puVar6 = (undefined8 *)((long)src + lVar47 + 0x20);
          uVar17 = puVar6[1];
          pBVar25 = pBVar24 + lVar47 + 0x20;
          *(undefined8 *)pBVar25 = *puVar6;
          *(undefined8 *)(pBVar25 + 8) = uVar17;
          puVar6 = (undefined8 *)((long)src + lVar47 + 0x30);
          uVar17 = puVar6[1];
          *(undefined8 *)(pBVar25 + 0x10) = *puVar6;
          *(undefined8 *)(pBVar25 + 0x18) = uVar17;
          lVar47 = lVar47 + 0x20;
        } while (pBVar25 + 0x20 < pBVar24 + uVar41);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar41;
  if (0xffff < uVar41) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  uVar28 = unaff_R15 - 3;
  psVar15 = *ppsVar4;
  psVar15->litLength = (U16)uVar41;
  uVar30 = (uint)local_e0;
  psVar15->offset = uVar30 + 3;
  uVar41 = (ulong)local_e0 & 0xffffffff;
joined_r0x005dca29:
  if (0xffff < uVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
    uVar41 = (ulong)uVar30;
  }
  psVar15->matchLength = (U16)uVar28;
  *ppsVar4 = psVar15 + 1;
  puVar40 = (ulong *)((long)puVar40 + unaff_R15);
  src = puVar40;
  uVar45 = uVar35;
  if (puVar40 <= puVar9) {
    uVar45 = UVar44 + 2;
    lVar47 = *(long *)(pBVar12 + uVar45);
    pUVar13[(ulong)(lVar47 * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] = uVar45;
    pUVar13[(ulong)(*(long *)((long)puVar40 + -2) * -0x30e44323485a9b9d) >> (bVar22 & 0x3f)] =
         ((int)puVar40 + -2) - iVar34;
    pUVar14[(ulong)(lVar47 * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] = uVar45;
    pUVar14[(ulong)(*(long *)((long)puVar40 + -1) * -0x30e44323405a9d00) >> (bVar23 & 0x3f)] =
         ((int)puVar40 + -1) - iVar34;
    uVar28 = (ulong)uVar35;
    do {
      uVar33 = uVar28;
      uVar45 = (uint)uVar33;
      uVar30 = (uint)uVar41;
      src = puVar40;
      if ((uVar45 == 0) || ((int)*puVar40 != *(int *)((long)puVar40 - uVar33))) break;
      puVar31 = (ulong *)((long)puVar40 + 4);
      puVar32 = (ulong *)((long)puVar40 + (4 - uVar33));
      puVar42 = puVar31;
      if (puVar31 < puVar1) {
        uVar36 = *puVar31 ^ *puVar32;
        uVar28 = 0;
        if (uVar36 != 0) {
          for (; (uVar36 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        uVar28 = uVar28 >> 3 & 0x1fffffff;
        if (*puVar32 == *puVar31) {
          puVar42 = (ulong *)((long)puVar40 + 0xc);
          puVar32 = (ulong *)((long)puVar40 + (0xc - uVar33));
          do {
            if (puVar1 <= puVar42) goto LAB_005dcb6b;
            uVar36 = *puVar32;
            uVar37 = *puVar42;
            uVar29 = uVar37 ^ uVar36;
            uVar28 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = (long)puVar42 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar31);
            puVar42 = puVar42 + 1;
            puVar32 = puVar32 + 1;
          } while (uVar36 == uVar37);
        }
      }
      else {
LAB_005dcb6b:
        if ((puVar42 < puVar2) && ((int)*puVar32 == (int)*puVar42)) {
          puVar42 = (ulong *)((long)puVar42 + 4);
          puVar32 = (ulong *)((long)puVar32 + 4);
        }
        if ((puVar42 < puVar3) && ((short)*puVar32 == (short)*puVar42)) {
          puVar42 = (ulong *)((long)puVar42 + 2);
          puVar32 = (ulong *)((long)puVar32 + 2);
        }
        if (puVar42 < puVar5) {
          puVar42 = (ulong *)((long)puVar42 + (ulong)((char)*puVar32 == (char)*puVar42));
        }
        uVar28 = (long)puVar42 - (long)puVar31;
      }
      uVar36 = *puVar40;
      UVar44 = (int)puVar40 - iVar34;
      pUVar14[uVar36 * -0x30e44323405a9d00 >> (bVar23 & 0x3f)] = UVar44;
      pUVar13[uVar36 * -0x30e44323485a9b9d >> (bVar22 & 0x3f)] = UVar44;
      if (puVar40 <= puVar19) {
        puVar31 = (ulong *)seqStore->lit;
        uVar36 = puVar40[1];
        *puVar31 = *puVar40;
        puVar31[1] = uVar36;
      }
      psVar15 = seqStore->sequences;
      psVar15->litLength = 0;
      psVar15->offset = 1;
      if (0xffff < uVar28 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar15 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar15->matchLength = (U16)(uVar28 + 1);
      seqStore->sequences = psVar15 + 1;
      puVar40 = (ulong *)((long)puVar40 + uVar28 + 4);
      uVar28 = uVar41;
      src = puVar40;
      uVar41 = uVar33;
      uVar45 = uVar30;
    } while (puVar40 <= puVar9);
  }
LAB_005dcc6f:
  uVar30 = (uint)uVar41;
  puVar31 = puVar40;
  if (puVar9 <= puVar40) goto LAB_005defc6;
  goto LAB_005dc540;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}